

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

WeakArenaReference<Js::IDiagObjectModelWalkerBase> * __thiscall
Js::RecyclableKeyValueDisplay::CreateWalker(RecyclableKeyValueDisplay *this)

{
  LONG *pLVar1;
  _func_int **pp_Var2;
  ScriptContext *pSVar3;
  _func_int **pp_Var4;
  ReferencedArenaAdapter *pRVar5;
  IDiagObjectModelWalkerBase *pIVar6;
  HeapAllocator *alloc;
  WeakArenaReference<Js::IDiagObjectModelWalkerBase> *pWVar7;
  ArenaAllocator *alloc_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  pRVar5 = DebugManager::GetDiagnosticArena(this->scriptContext->threadContext->debugManager);
  if (pRVar5 == (ReferencedArenaAdapter *)0x0) {
    pWVar7 = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0;
  }
  else {
    alloc_00 = (ArenaAllocator *)0x0;
    if (pRVar5->deleteFlag == false) {
      alloc_00 = pRVar5->arena;
    }
    pIVar6 = (IDiagObjectModelWalkerBase *)new<Memory::ArenaAllocator>(0x20,alloc_00,0x366bee);
    pSVar3 = this->scriptContext;
    pp_Var4 = (_func_int **)this->key;
    pp_Var2 = (_func_int **)this->value;
    pIVar6->_vptr_IDiagObjectModelWalkerBase = (_func_int **)&PTR_Get_014f88e0;
    pIVar6[1]._vptr_IDiagObjectModelWalkerBase = (_func_int **)pSVar3;
    pIVar6[2]._vptr_IDiagObjectModelWalkerBase = pp_Var4;
    pIVar6[3]._vptr_IDiagObjectModelWalkerBase = pp_Var2;
    local_48 = (undefined1  [8])
               &Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_3d84632;
    data.filename._0_4_ = 0xe41;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_48);
    pWVar7 = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)
             new<Memory::HeapAllocator>(0x10,alloc,0x300d4a);
    pWVar7->adapter = pRVar5;
    pWVar7->p = pIVar6;
    LOCK();
    pLVar1 = &(pRVar5->super_RefCounted).refCount;
    *pLVar1 = *pLVar1 + 1;
    UNLOCK();
  }
  return pWVar7;
}

Assistant:

WeakArenaReference<IDiagObjectModelWalkerBase>* RecyclableKeyValueDisplay::CreateWalker()
    {
        ReferencedArenaAdapter* pRefArena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena();
        if (pRefArena)
        {
            IDiagObjectModelWalkerBase* pOMWalker = Anew(pRefArena->Arena(), RecyclableKeyValueWalker, scriptContext, key, value);
            return HeapNew(WeakArenaReference<IDiagObjectModelWalkerBase>, pRefArena, pOMWalker);
        }
        return nullptr;
    }